

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O0

void __thiscall Imf_2_5::Header::~Header(Header *this)

{
  bool bVar1;
  pointer ppVar2;
  _Rb_tree_iterator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_> *in_RDI;
  iterator i;
  map<Imf_2_5::Name,_Imf_2_5::Attribute_*,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
  *in_stack_ffffffffffffffd8;
  _Self local_18;
  _Self local_10 [2];
  
  local_10[0]._M_node =
       (_Base_ptr)
       std::
       map<Imf_2_5::Name,_Imf_2_5::Attribute_*,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
       ::begin(in_stack_ffffffffffffffd8);
  while( true ) {
    local_18._M_node =
         (_Base_ptr)
         std::
         map<Imf_2_5::Name,_Imf_2_5::Attribute_*,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
         ::end(in_stack_ffffffffffffffd8);
    bVar1 = std::operator!=(local_10,&local_18);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>::
             operator->((_Rb_tree_iterator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_> *)
                        0x772c4b);
    in_stack_ffffffffffffffd8 =
         (map<Imf_2_5::Name,_Imf_2_5::Attribute_*,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
          *)ppVar2->second;
    if (in_stack_ffffffffffffffd8 !=
        (map<Imf_2_5::Name,_Imf_2_5::Attribute_*,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
         *)0x0) {
      (*(*(_func_int ***)&(in_stack_ffffffffffffffd8->_M_t)._M_impl)[1])();
    }
    std::_Rb_tree_iterator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>::operator++
              (in_RDI);
  }
  std::
  map<Imf_2_5::Name,_Imf_2_5::Attribute_*,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
  ::~map((map<Imf_2_5::Name,_Imf_2_5::Attribute_*,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
          *)0x772c7e);
  return;
}

Assistant:

Header::~Header ()
{
    for (AttributeMap::iterator i = _map.begin();
	 i != _map.end();
	 ++i)
    {
	 delete i->second;
    }
}